

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O1

void order_children(int n_col,Colamd_Col *Col,int *p)

{
  uint uVar1;
  ulong uVar2;
  anon_union_4_2_0da084e5_for_shared2 *paVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  if (0 < n_col) {
    uVar2 = 0;
    do {
      if ((Col[uVar2].start != -1) && (Col[uVar2].shared2.score == -1)) {
        uVar4 = uVar2 & 0xffffffff;
        do {
          uVar1 = Col[(int)uVar4].shared1.thickness;
          uVar4 = (ulong)(int)uVar1;
        } while (Col[uVar4].start != -1);
        iVar5 = Col[uVar4].shared2.score;
        uVar6 = uVar2 & 0xffffffff;
        do {
          Col[(int)uVar6].shared2.score = iVar5;
          iVar5 = iVar5 + 1;
          Col[(int)uVar6].shared1.thickness = uVar1;
          uVar6 = (ulong)uVar1;
        } while (Col[uVar4].shared2.score == -1);
        Col[uVar4].shared2.score = iVar5;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)n_col);
  }
  if (0 < n_col) {
    paVar3 = &Col->shared2;
    uVar2 = 0;
    do {
      p[paVar3->score] = (int)uVar2;
      uVar2 = uVar2 + 1;
      paVar3 = paVar3 + 6;
    } while ((uint)n_col != uVar2);
  }
  return;
}

Assistant:

PRIVATE void order_children
(
    /* === Parameters ======================================================= */

    Int n_col,			/* number of columns of A */
    Colamd_Col Col [],		/* of size n_col+1 */
    Int p []			/* p [0 ... n_col-1] is the column permutation*/
)
{
    /* === Local variables ================================================== */

    Int i ;			/* loop counter for all columns */
    Int c ;			/* column index */
    Int parent ;		/* index of column's parent */
    Int order ;			/* column's order */

    /* === Order each non-principal column ================================== */

    for (i = 0 ; i < n_col ; i++)
    {
	/* find an un-ordered non-principal column */
	ASSERT (COL_IS_DEAD (i)) ;
	if (!COL_IS_DEAD_PRINCIPAL (i) && Col [i].shared2.order == COLAMD_EMPTY)
	{
	    parent = i ;
	    /* once found, find its principal parent */
	    do
	    {
		parent = Col [parent].shared1.parent ;
	    } while (!COL_IS_DEAD_PRINCIPAL (parent)) ;

	    /* now, order all un-ordered non-principal columns along path */
	    /* to this parent.  collapse tree at the same time */
	    c = i ;
	    /* get order of parent */
	    order = Col [parent].shared2.order ;

	    do
	    {
		ASSERT (Col [c].shared2.order == COLAMD_EMPTY) ;

		/* order this column */
		Col [c].shared2.order = order++ ;
		/* collaps tree */
		Col [c].shared1.parent = parent ;

		/* get immediate parent of this column */
		c = Col [c].shared1.parent ;

		/* continue until we hit an ordered column.  There are */
		/* guaranteed not to be anymore unordered columns */
		/* above an ordered column */
	    } while (Col [c].shared2.order == COLAMD_EMPTY) ;

	    /* re-order the super_col parent to largest order for this group */
	    Col [parent].shared2.order = order ;
	}
    }

    /* === Generate the permutation ========================================= */

    for (c = 0 ; c < n_col ; c++)
    {
	p [Col [c].shared2.order] = c ;
    }
}